

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::SetHoleState(Clipper *this,TEdge *e,OutRec *outrec)

{
  reference ppOVar1;
  TEdge *local_30;
  TEdge *eTmp;
  TEdge *e2;
  OutRec *outrec_local;
  TEdge *e_local;
  Clipper *this_local;
  
  eTmp = e->PrevInAEL;
  local_30 = (TEdge *)0x0;
  for (; eTmp != (TEdge *)0x0; eTmp = eTmp->PrevInAEL) {
    if ((-1 < eTmp->OutIdx) && (eTmp->WindDelta != 0)) {
      if (local_30 == (TEdge *)0x0) {
        local_30 = eTmp;
      }
      else if (local_30->OutIdx == eTmp->OutIdx) {
        local_30 = (TEdge *)0x0;
      }
    }
  }
  if (local_30 == (TEdge *)0x0) {
    outrec->FirstLeft = (OutRec *)0x0;
    outrec->IsHole = false;
  }
  else {
    ppOVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                         ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),
                         (long)local_30->OutIdx);
    outrec->FirstLeft = *ppOVar1;
    outrec->IsHole = (bool)((outrec->FirstLeft->IsHole ^ 0xffU) & 1);
  }
  return;
}

Assistant:

void Clipper::SetHoleState(TEdge *e, OutRec *outrec)
{
  TEdge *e2 = e->PrevInAEL;
  TEdge *eTmp = 0;
  while (e2)
  {
    if (e2->OutIdx >= 0 && e2->WindDelta != 0)
    {
      if (!eTmp) eTmp = e2;
      else if (eTmp->OutIdx == e2->OutIdx) eTmp = 0;        
    }
    e2 = e2->PrevInAEL;
  }
  if (!eTmp)
  {
    outrec->FirstLeft = 0;
    outrec->IsHole = false;
  }
  else
  {
    outrec->FirstLeft = m_PolyOuts[eTmp->OutIdx];
    outrec->IsHole = !outrec->FirstLeft->IsHole;
  }
}